

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O2

dynlink ext_loader_impl_load_from_file_dynlink(char *path,char *library_name)

{
  bool bVar1;
  dynlink pdVar2;
  char *path_local;
  path lib_path;
  dynlink_name_impl platform_name;
  
  path_local = path;
  dynlink_platform_name(library_name,&platform_name);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&lib_path,&path_local,auto_format);
  std::filesystem::__cxx11::path::operator/=(&lib_path,&platform_name);
  bVar1 = std::filesystem::exists(&lib_path);
  if (bVar1) {
    pdVar2 = (dynlink)dynlink_load(path_local,library_name,10);
  }
  else {
    pdVar2 = (dynlink)0x0;
  }
  std::filesystem::__cxx11::path::~path(&lib_path);
  return pdVar2;
}

Assistant:

dynlink ext_loader_impl_load_from_file_dynlink(const char *path, const char *library_name)
{
	/* This function will try to check if the library exists before loading it,
	so we avoid error messages from dynlink when guessing the file path for relative load from file */
	dynlink_name_impl platform_name;

	dynlink_platform_name(library_name, platform_name);

	fs::path lib_path(path);

	lib_path /= platform_name;

	if (fs::exists(lib_path) == false)
	{
		return NULL;
	}

	return dynlink_load(path, library_name, DYNLINK_FLAGS_BIND_LAZY | DYNLINK_FLAGS_BIND_GLOBAL);
}